

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O1

json_token * __thiscall
mjs::anon_unknown_46::json_lexer::next_token(json_token *__return_storage_ptr__,json_lexer *this)

{
  wchar_t wVar1;
  ulong uVar2;
  pointer pwVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  wostream *pwVar7;
  native_error_exception *pnVar8;
  global_object *pgVar9;
  ulong uVar10;
  ulong uVar11;
  wstring_view *s_00;
  wstring_view *s_01;
  _Alloc_hider _Var12;
  ushort uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  anon_class_16_2_032a7d33 invalid;
  size_t start;
  wstring s;
  wostringstream woss;
  wstring local_240;
  wstring *local_220;
  ulong local_218;
  wstring_view local_210;
  long local_200 [2];
  wstring_view local_1f0;
  wstring local_1e0;
  uint local_1bc;
  wstring_view local_1b8;
  undefined1 local_1a8 [8];
  _Alloc_hider local_1a0;
  size_type local_198;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_190;
  ulong local_180;
  
  uVar2 = (this->text_)._M_string_length;
  uVar16 = this->pos_;
  if (uVar2 <= uVar16) {
    local_1a8._0_4_ = eof;
    local_198 = 0;
    local_190._M_local_buf[0] = L'\0';
    (this->tok_).type_ = eof;
    local_1a0._M_p = (pointer)&local_190;
    local_180 = uVar16;
    std::__cxx11::wstring::operator=((wstring *)&(this->tok_).text_,(wstring *)&local_1a0);
    (this->tok_).pos_ = local_180;
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_1a0._M_p != &local_190) {
      operator_delete(local_1a0._M_p,
                      CONCAT44(local_190._M_local_buf[1],local_190._M_local_buf[0]) * 4 + 4);
    }
    goto LAB_00147c9d;
  }
  pwVar3 = (this->text_)._M_dataplus._M_p;
  wVar1 = pwVar3[uVar16];
  uVar14 = wVar1 & 0xffff;
  uVar15 = uVar16 + 1;
  this->pos_ = uVar15;
  uVar13 = (ushort)wVar1;
  local_218 = uVar16;
  if ((uVar13 < 0x21) && ((0x100002600U >> ((ulong)uVar14 & 0x3f) & 1) != 0)) {
    uVar10 = uVar15;
    if (uVar15 < uVar2) {
      do {
        uVar11 = (ulong)(ushort)pwVar3[uVar15];
        uVar10 = uVar15;
        if ((0x20 < uVar11) || ((0x100002600U >> (uVar11 & 0x3f) & 1) == 0)) break;
        uVar15 = uVar15 + 1;
        uVar10 = uVar2;
      } while (uVar2 != uVar15);
    }
    local_1a8._0_4_ = whitespace;
    local_198 = 0;
    local_190._M_local_buf[0] = L'\0';
    (this->tok_).type_ = whitespace;
    local_1a0._M_p = (pointer)&local_190;
    local_180 = uVar16;
    std::__cxx11::wstring::operator=((wstring *)&(this->tok_).text_,(wstring *)&local_1a0);
    (this->tok_).pos_ = local_180;
    uVar15 = uVar10;
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_1a0._M_p != &local_190) {
      lVar6 = CONCAT44(local_190._M_local_buf[1],local_190._M_local_buf[0]);
      _Var12._M_p = local_1a0._M_p;
LAB_00147773:
      operator_delete(_Var12._M_p,lVar6 * 4 + 4);
    }
  }
  else {
    local_220 = &this->text_;
    if (uVar14 < 0x66) {
      if (uVar14 < 0x5b) {
        if (uVar14 == 0x2c) {
          local_1a8._0_4_ = comma;
        }
        else {
          if (uVar14 != 0x3a) goto LAB_00147885;
          local_1a8._0_4_ = colon;
        }
      }
      else if (uVar14 == 0x5b) {
        local_1a8._0_4_ = lbracket;
      }
      else {
        if (uVar14 != 0x5d) goto LAB_00147885;
        local_1a8._0_4_ = rbracket;
      }
      goto LAB_00147ad4;
    }
    if (uVar14 < 0x74) {
      if (uVar14 == 0x66) {
        iVar5 = std::__cxx11::wstring::compare((ulong)local_220,uVar15,(wchar_t *)0x4);
        if (iVar5 == 0) {
          local_1a8._0_4_ = false_;
          local_198 = 0;
          local_190._M_local_buf[0] = L'\0';
          local_180 = local_218;
          (this->tok_).type_ = false_;
          local_1a0._M_p = (pointer)&local_190;
          std::__cxx11::wstring::operator=((wstring *)&(this->tok_).text_,(wstring *)&local_1a0);
          (this->tok_).pos_ = local_180;
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_1a0._M_p != &local_190) {
            operator_delete(local_1a0._M_p,
                            CONCAT44(local_190._M_local_buf[1],local_190._M_local_buf[0]) * 4 + 4);
          }
          uVar15 = uVar16 + 5;
          goto LAB_00147c99;
        }
      }
      else if ((uVar14 == 0x6e) &&
              (iVar5 = std::__cxx11::wstring::compare((ulong)local_220,uVar15,(wchar_t *)0x3),
              iVar5 == 0)) {
        local_1a8._0_4_ = null;
        goto LAB_00147c32;
      }
    }
    else {
      if (uVar14 != 0x74) {
        if (uVar14 == 0x7b) {
          local_1a8._0_4_ = lbrace;
        }
        else {
          if (uVar14 != 0x7d) goto LAB_00147885;
          local_1a8._0_4_ = rbrace;
        }
LAB_00147ad4:
        local_198 = 0;
        local_190._M_local_buf[0] = L'\0';
        (this->tok_).type_ = local_1a8._0_4_;
        local_1a0._M_p = (pointer)&local_190;
        local_180 = uVar16;
        std::__cxx11::wstring::operator=((wstring *)&(this->tok_).text_,(wstring *)&local_1a0);
        (this->tok_).pos_ = local_180;
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_1a0._M_p != &local_190) {
          operator_delete(local_1a0._M_p,
                          CONCAT44(local_190._M_local_buf[1],local_190._M_local_buf[0]) * 4 + 4);
        }
        goto LAB_00147c99;
      }
      iVar5 = std::__cxx11::wstring::compare((ulong)local_220,uVar15,(wchar_t *)0x3);
      if (iVar5 == 0) {
        local_1a8._0_4_ = true_;
LAB_00147c32:
        local_198 = 0;
        local_190._M_local_buf[0] = L'\0';
        local_180 = local_218;
        (this->tok_).type_ = local_1a8._0_4_;
        local_1a0._M_p = (pointer)&local_190;
        std::__cxx11::wstring::operator=((wstring *)&(this->tok_).text_,(wstring *)&local_1a0);
        (this->tok_).pos_ = local_180;
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_1a0._M_p != &local_190) {
          operator_delete(local_1a0._M_p,
                          CONCAT44(local_190._M_local_buf[1],local_190._M_local_buf[0]) * 4 + 4);
        }
        uVar15 = uVar16 + 4;
        goto LAB_00147c99;
      }
    }
LAB_00147885:
    if (uVar14 == 0x2d || 0xfff5 < (ushort)(uVar13 - 0x3a)) {
      local_240._M_dataplus._M_p = (pointer)&local_218;
      if ((uVar15 < uVar2) &&
         (pwVar3 = (local_220->_M_dataplus)._M_p, (uint)(pwVar3[uVar16 + 1] + L'\xffffffd0') < 10))
      {
        uVar16 = uVar15;
        do {
          bVar4 = true;
          uVar15 = uVar2;
          if ((2 - uVar2) + uVar16 == 1) break;
          lVar6 = uVar16 + 1;
          uVar15 = uVar16 + 1;
          uVar16 = uVar15;
        } while ((uint)(pwVar3[lVar6] + L'\xffffffd0') < 10);
      }
      else {
        bVar4 = false;
      }
      local_240._M_string_length = (size_type)this;
      if (uVar14 == 0x2d && !bVar4) goto LAB_001481e5;
      if ((uVar15 < uVar2) && (pwVar3 = (local_220->_M_dataplus)._M_p, pwVar3[uVar15] == L'.')) {
        uVar16 = uVar15 + 1;
        if ((uVar16 < uVar2) && ((uint)(pwVar3[uVar15 + 1] + L'\xffffffd0') < 10)) {
          do {
            bVar4 = true;
            uVar15 = uVar2;
            if ((2 - uVar2) + uVar16 == 1) break;
            lVar6 = uVar16 + 1;
            uVar15 = uVar16 + 1;
            uVar16 = uVar15;
          } while ((uint)(pwVar3[lVar6] + L'\xffffffd0') < 10);
        }
        else {
          bVar4 = false;
          uVar15 = uVar16;
        }
        if (!bVar4) goto LAB_001481e5;
      }
      if ((uVar15 < uVar2) && (((local_220->_M_dataplus)._M_p[uVar15] | 0x20U) == 0x65)) {
        uVar16 = uVar15 + 1;
        if (uVar16 == uVar2) {
LAB_001481e5:
          next_token::anon_class_16_2_032a7d33::operator()((anon_class_16_2_032a7d33 *)&local_240);
LAB_001481ef:
          std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
          pwVar7 = std::operator<<((wostream *)local_1a8,
                                   "Unterminated escape sequence in JSON at position ");
          std::wostream::_M_insert<unsigned_long>((ulong)pwVar7);
          pnVar8 = (native_error_exception *)__cxa_allocate_exception(0x58);
          pgVar9 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
          global_object::stack_trace_abi_cxx11_(&local_240,pgVar9);
          local_1f0._M_len = local_240._M_string_length;
          local_1f0._M_str = local_240._M_dataplus._M_p;
          std::__cxx11::wstringbuf::str();
          local_1b8._M_len = (size_t)local_210._M_str;
          local_1b8._M_str = (wchar_t *)local_210._M_len;
          native_error_exception::native_error_exception(pnVar8,syntax,&local_1f0,&local_1b8);
          __cxa_throw(pnVar8,&native_error_exception::typeinfo,
                      native_error_exception::~native_error_exception);
        }
        pwVar3 = (local_220->_M_dataplus)._M_p;
        if ((pwVar3[uVar15 + 1] == L'-') || (pwVar3[uVar15 + 1] == L'+')) {
          uVar16 = uVar15 + 2;
        }
        if ((uVar16 < uVar2) && ((uint)(pwVar3[uVar16] + L'\xffffffd0') < 10)) {
          do {
            bVar4 = true;
            uVar15 = uVar2;
            if (uVar2 - 1 == uVar16) break;
            lVar6 = uVar16 + 1;
            uVar15 = uVar16 + 1;
            uVar16 = uVar15;
          } while ((uint)(pwVar3[lVar6] + L'\xffffffd0') < 10);
        }
        else {
          bVar4 = false;
          uVar15 = uVar16;
        }
        if (!bVar4) goto LAB_001481e5;
      }
      std::__cxx11::wstring::substr((ulong)&local_1e0,(ulong)local_220);
      json_token::json_token((json_token *)local_1a8,number,&local_1e0,local_218);
      (this->tok_).type_ = local_1a8._0_4_;
      std::__cxx11::wstring::operator=((wstring *)&(this->tok_).text_,(wstring *)&local_1a0);
      (this->tok_).pos_ = local_180;
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_1a0._M_p != &local_190) {
        operator_delete(local_1a0._M_p,
                        CONCAT44(local_190._M_local_buf[1],local_190._M_local_buf[0]) * 4 + 4);
      }
    }
    else {
      if (uVar14 != 0x22) {
        std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
        pwVar7 = std::operator<<((wostream *)local_1a8,"Unexpected token \"");
        std::__cxx11::wstring::substr((ulong)&local_240,(ulong)local_220);
        local_210._M_len = local_240._M_string_length;
        local_210._M_str = local_240._M_dataplus._M_p;
        cpp_quote_abi_cxx11_(&local_1e0,(mjs *)&local_210,s_01);
        pwVar7 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           (pwVar7,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
        pwVar7 = std::operator<<(pwVar7,"\" in JSON at position ");
        std::wostream::_M_insert<unsigned_long>((ulong)pwVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,
                          CONCAT44(local_1e0.field_2._M_local_buf[1],
                                   local_1e0.field_2._M_local_buf[0]) * 4 + 4);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity * 4 + 4
                         );
        }
        pnVar8 = (native_error_exception *)__cxa_allocate_exception(0x58);
        pgVar9 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
        global_object::stack_trace_abi_cxx11_(&local_1e0,pgVar9);
        local_210._M_len = local_1e0._M_string_length;
        local_210._M_str = local_1e0._M_dataplus._M_p;
        std::__cxx11::wstringbuf::str();
        local_1f0._M_len = local_240._M_string_length;
        local_1f0._M_str = local_240._M_dataplus._M_p;
        native_error_exception::native_error_exception(pnVar8,syntax,&local_210,&local_1f0);
        __cxa_throw(pnVar8,&native_error_exception::typeinfo,
                    native_error_exception::~native_error_exception);
      }
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      local_1e0._M_string_length = 0;
      local_1e0.field_2._M_local_buf[0] = L'\0';
      uVar10 = 0;
      uVar16 = uVar15;
      do {
        if (uVar16 == uVar2) {
          std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
          pwVar7 = std::operator<<((wostream *)local_1a8,"Unterminated string in JSON at position ")
          ;
          std::wostream::_M_insert<unsigned_long>((ulong)pwVar7);
          pnVar8 = (native_error_exception *)__cxa_allocate_exception(0x58);
          pgVar9 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
          global_object::stack_trace_abi_cxx11_(&local_240,pgVar9);
          local_1f0._M_len = local_240._M_string_length;
          local_1f0._M_str = local_240._M_dataplus._M_p;
          std::__cxx11::wstringbuf::str();
          local_1b8._M_len = (size_t)local_210._M_str;
          local_1b8._M_str = (wchar_t *)local_210._M_len;
          native_error_exception::native_error_exception(pnVar8,syntax,&local_1f0,&local_1b8);
          __cxa_throw(pnVar8,&native_error_exception::typeinfo,
                      native_error_exception::~native_error_exception);
        }
        uVar15 = uVar16 + 1;
        pwVar3 = (local_220->_M_dataplus)._M_p;
        uVar13 = (ushort)pwVar3[uVar16];
        uVar14 = (uint)uVar13;
        if ((uVar10 & 1) == 0) {
          if (uVar14 == 0x22) {
            bVar4 = false;
          }
          else if (uVar14 == 0x5c) {
            uVar10 = CONCAT71((int7)(uVar10 >> 8),1);
            bVar4 = true;
          }
          else {
            local_1bc = (uint)uVar10;
            if (uVar14 < 0x20) {
              std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
              pwVar7 = std::operator<<((wostream *)local_1a8,"Invalid character \"");
              std::__cxx11::wstring::substr((ulong)&local_210,(ulong)local_220);
              local_1f0._M_len = (size_t)local_210._M_str;
              local_1f0._M_str = (wchar_t *)local_210._M_len;
              cpp_quote_abi_cxx11_(&local_240,(mjs *)&local_1f0,s_00);
              pwVar7 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                 (pwVar7,local_240._M_dataplus._M_p,local_240._M_string_length);
              pwVar7 = std::operator<<(pwVar7,"\" in JSON at position ");
              std::wostream::_M_insert<unsigned_long>((ulong)pwVar7);
              if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                   *)local_240._M_dataplus._M_p != &local_240.field_2) {
                operator_delete(local_240._M_dataplus._M_p,
                                local_240.field_2._M_allocated_capacity * 4 + 4);
              }
              if ((long *)local_210._M_len != local_200) {
                operator_delete((void *)local_210._M_len,local_200[0] * 4 + 4);
              }
              pnVar8 = (native_error_exception *)__cxa_allocate_exception(0x58);
              pgVar9 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
              global_object::stack_trace_abi_cxx11_(&local_240,pgVar9);
              local_1f0._M_len = local_240._M_string_length;
              local_1f0._M_str = local_240._M_dataplus._M_p;
              std::__cxx11::wstringbuf::str();
              local_1b8._M_len = (size_t)local_210._M_str;
              local_1b8._M_str = (wchar_t *)local_210._M_len;
              native_error_exception::native_error_exception(pnVar8,syntax,&local_1f0,&local_1b8);
              __cxa_throw(pnVar8,&native_error_exception::typeinfo,
                          native_error_exception::~native_error_exception);
            }
            bVar4 = true;
            std::__cxx11::wstring::push_back((wchar_t)&local_1e0);
            uVar10 = (ulong)local_1bc;
          }
        }
        else {
          if (uVar15 == uVar2) {
            std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
            pwVar7 = std::operator<<((wostream *)local_1a8,
                                     "Unterminated escape sequence in JSON at position ");
            std::wostream::_M_insert<unsigned_long>((ulong)pwVar7);
            pnVar8 = (native_error_exception *)__cxa_allocate_exception(0x58);
            pgVar9 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
            global_object::stack_trace_abi_cxx11_(&local_240,pgVar9);
            local_1f0._M_len = local_240._M_string_length;
            local_1f0._M_str = local_240._M_dataplus._M_p;
            std::__cxx11::wstringbuf::str();
            local_1b8._M_len = (size_t)local_210._M_str;
            local_1b8._M_str = (wchar_t *)local_210._M_len;
            native_error_exception::native_error_exception(pnVar8,syntax,&local_1f0,&local_1b8);
            __cxa_throw(pnVar8,&native_error_exception::typeinfo,
                        native_error_exception::~native_error_exception);
          }
          if (uVar14 == 0x61 || uVar13 < 0x61) {
            if (((uVar14 != 0x22) && (uVar14 != 0x2f)) && (uVar14 != 0x5c))
            goto switchD_0014793d_caseD_6f;
          }
          else {
            switch(uVar13) {
            case 0x6e:
              break;
            case 0x6f:
            case 0x70:
            case 0x71:
            case 0x73:
switchD_0014793d_caseD_6f:
              std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
              pwVar7 = std::operator<<((wostream *)local_1a8,"Invalid escape sequence \"\\");
              local_240._M_dataplus._M_p._0_4_ = uVar14;
              pwVar7 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                 (pwVar7,(wchar_t *)&local_240,1);
              pwVar7 = std::operator<<(pwVar7,"\" in JSON at position ");
              std::wostream::_M_insert<unsigned_long>((ulong)pwVar7);
              pnVar8 = (native_error_exception *)__cxa_allocate_exception(0x58);
              pgVar9 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
              global_object::stack_trace_abi_cxx11_(&local_240,pgVar9);
              local_1f0._M_len = local_240._M_string_length;
              local_1f0._M_str = local_240._M_dataplus._M_p;
              std::__cxx11::wstringbuf::str();
              local_1b8._M_len = (size_t)local_210._M_str;
              local_1b8._M_str = (wchar_t *)local_210._M_len;
              native_error_exception::native_error_exception(pnVar8,syntax,&local_1f0,&local_1b8);
              __cxa_throw(pnVar8,&native_error_exception::typeinfo,
                          native_error_exception::~native_error_exception);
            case 0x72:
              break;
            case 0x74:
              break;
            case 0x75:
              if (uVar16 + 6 <= uVar2) {
                get_hex_value4(pwVar3 + uVar15);
                std::__cxx11::wstring::push_back((wchar_t)&local_1e0);
                uVar15 = uVar16 + 5;
                bVar4 = true;
                uVar10 = 0;
                goto LAB_001479e6;
              }
              goto LAB_001481ef;
            default:
              if ((uVar14 != 0x66) && (uVar14 != 0x62)) goto switchD_0014793d_caseD_6f;
            }
          }
          std::__cxx11::wstring::push_back((wchar_t)&local_1e0);
          bVar4 = true;
          uVar10 = 0;
        }
LAB_001479e6:
        uVar16 = uVar15;
      } while (bVar4);
      json_token::json_token((json_token *)local_1a8,string,&local_1e0,local_218);
      (this->tok_).type_ = local_1a8._0_4_;
      std::__cxx11::wstring::operator=((wstring *)&(this->tok_).text_,(wstring *)&local_1a0);
      (this->tok_).pos_ = local_180;
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_1a0._M_p != &local_190) {
        operator_delete(local_1a0._M_p,
                        CONCAT44(local_190._M_local_buf[1],local_190._M_local_buf[0]) * 4 + 4);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      lVar6 = CONCAT44(local_1e0.field_2._M_local_buf[1],local_1e0.field_2._M_local_buf[0]);
      _Var12._M_p = local_1e0._M_dataplus._M_p;
      goto LAB_00147773;
    }
  }
LAB_00147c99:
  this->pos_ = uVar15;
LAB_00147c9d:
  __return_storage_ptr__->type_ = (this->tok_).type_;
  (__return_storage_ptr__->text_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->text_).field_2;
  pwVar3 = (this->tok_).text_._M_dataplus._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&__return_storage_ptr__->text_,pwVar3,
             pwVar3 + (this->tok_).text_._M_string_length);
  __return_storage_ptr__->pos_ = (this->tok_).pos_;
  return __return_storage_ptr__;
}

Assistant:

json_token next_token() {
        const auto len = text_.length();
        if (pos_ >= len) {
            tok_ = json_token{json_token_type::eof, pos_};
            return tok_;
        }

        const auto start = pos_;
        const char16_t ch = text_[pos_];
        auto end = ++pos_;

        if (json_is_whitespace(ch)) {
            while (end < len && json_is_whitespace(text_[end])) {
                ++end;
            }
            tok_ = json_token{json_token_type::whitespace, start};
        } else if (ch == '[') {
            tok_ = json_token{json_token_type::lbracket, start};
        } else if (ch == ']') {
            tok_ = json_token{json_token_type::rbracket, start};
        } else if (ch == '{') {
            tok_ = json_token{json_token_type::lbrace, start};
        } else if (ch == '}') {
            tok_ = json_token{json_token_type::rbrace, start};
        } else if (ch == ',') {
            tok_ = json_token{json_token_type::comma, start};
        } else if (ch == ':') {
            tok_ = json_token{json_token_type::colon, start};
        } else if (ch == 'n' && text_.compare(end, 3, L"ull") == 0) {
            end += 3;
            tok_ = json_token{json_token_type::null, start};
        } else if (ch == 'f' && text_.compare(end, 4, L"alse") == 0) {
            end += 4;
            tok_ = json_token{json_token_type::false_, start};
        } else if (ch == 't' && text_.compare(end, 3, L"rue") == 0) {
            end += 3;
            tok_ = json_token{json_token_type::true_, start};
        } else if (ch == '-' || json_is_digit(ch)) {
            auto invalid = [&]() {
                std::wostringstream woss;
                woss << "Invalid number in JSON at position " << start;
                throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
            };
            auto decimal_digits = [&]() {
                bool any = false;
                while (end < len && isdigit(text_[end])) {
                    any = true;
                    ++end;
                }
                return any;
            };
            if (!decimal_digits() && ch == '-') {
                invalid();
            }
            if (end < len && text_[end] == '.') {
                ++end;
                if (!decimal_digits()) {
                    invalid();
                }
            }
            if (end < len && (text_[end] == 'e' || text_[end] == 'E')) {
                ++end;
                if (end == len) {
                    invalid();
                }
                if (text_[end] == '-' || text_[end] == '+') {
                    ++end;
                }
                if (!decimal_digits()) {
                    invalid();
                }
            }
            tok_ = json_token{json_token_type::number, text_.substr(start, end-start), start};
        } else if (ch == '"') {
            std::wstring s;
            for (bool escape = false;;) {
                if (end == len) {
                    std::wostringstream woss;
                    woss << "Unterminated string in JSON at position " << start;
                    throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
                }
                const char16_t sch = text_[end++];
                if (escape) {
                    if (end == len) {
                        std::wostringstream woss;
                        woss << "Unterminated escape sequence in JSON at position " << end-1;
                        throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
                    }
                    switch (sch) {
                    case '"': [[fallthrough]];
                    case '/': [[fallthrough]];
                    case '\\':
                        s.push_back(sch);
                        break;
                    case 'b': s.push_back(8); break;
                    case 'f': s.push_back(12); break;
                    case 'n': s.push_back(10); break;
                    case 'r': s.push_back(13); break;
                    case 't': s.push_back(9); break;
                    case 'u':
                        if (end + 5 > len) {
                            std::wostringstream woss;
                            woss << "Unterminated escape sequence in JSON at position " << end-1;
                            throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
                        }
                        try {
                            s.push_back(static_cast<char16_t>(get_hex_value4(&text_[end])));
                        } catch (const std::runtime_error&) {
                            std::wostringstream woss;
                            woss << "Invalid escape sequence in JSON at position " << end-1;
                            throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
                        }
                        end+=4;
                        break;
                    default:
                        {
                            std::wostringstream woss;
                            woss << "Invalid escape sequence \"\\" << (wchar_t)sch << "\" in JSON at position " << end-1;
                            throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
                        }
                    }
                    escape = false;
                } else if (sch == '"') {
                    break;
                } else if (sch == '\\') {
                    escape = true;
                } else if (sch < 0x20) {
                    std::wostringstream woss;
                    woss << "Invalid character \"" << cpp_quote(text_.substr(end - 1, 1)) << "\" in JSON at position " << end - 1;
                    throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
                } else {
                    s.push_back(sch);
                }
            }
            tok_ = json_token{json_token_type::string, std::move(s), start};
        } else {
            std::wostringstream woss;
            woss << "Unexpected token \"" << cpp_quote(text_.substr(start, 1)) << "\" in JSON at position " << start;
            throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
        }

        pos_ = end;
        return tok_;
    }